

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
           *this,ComputePipelineStateCreateInfo *CI)

{
  void *pvVar1;
  IPipelineResourceSignature **ppIVar2;
  Char *pCVar3;
  Uint64 UVar4;
  ShaderResourceVariableDesc *pSVar5;
  ImmutableSamplerDesc *pIVar6;
  ComputePipelineStateCreateInfo *pCVar7;
  Uint32 UVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  SHADER_RESOURCE_VARIABLE_TYPE SVar11;
  undefined3 uVar12;
  SHADER_TYPE SVar13;
  PIPELINE_TYPE PVar14;
  undefined3 uVar15;
  Uint32 UVar16;
  pointer puVar17;
  ulong local_20;
  size_t i;
  ComputePipelineStateCreateInfo *CI_local;
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  *this_local;
  
  (this->super_ComputePipelineStateCreateInfo).pCS = CI->pCS;
  pvVar1 = (CI->super_PipelineStateCreateInfo).pInternalData;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.pPSOCache =
       (CI->super_PipelineStateCreateInfo).pPSOCache;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData = pvVar1;
  UVar8 = (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount;
  ppIVar2 = (CI->super_PipelineStateCreateInfo).ppResourceSignatures;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.Flags =
       (CI->super_PipelineStateCreateInfo).Flags;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount
       = UVar8;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures =
       ppIVar2;
  pCVar3 = (CI->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
  PVar14 = (CI->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  uVar15 = *(undefined3 *)&(CI->super_PipelineStateCreateInfo).PSODesc.field_0x9;
  UVar16 = (CI->super_PipelineStateCreateInfo).PSODesc.SRBAllocationGranularity;
  UVar4 = (CI->super_PipelineStateCreateInfo).PSODesc.ImmediateContextMask;
  SVar11 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType;
  uVar12 = *(undefined3 *)&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1;
  SVar13 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages;
  UVar8 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.NumVariables;
  uVar10 = *(undefined4 *)&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0xc;
  pSVar5 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.Variables;
  uVar9 = *(undefined4 *)&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1c;
  pIVar6 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.ImmutableSamplers;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumImmutableSamplers =
       (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.NumImmutableSamplers;
  *(undefined4 *)
   &(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    ResourceLayout.field_0x1c = uVar9;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  ImmutableSamplers = pIVar6;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumVariables = UVar8;
  *(undefined4 *)
   &(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    ResourceLayout.field_0xc = uVar10;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  Variables = pSVar5;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
  ImmediateContextMask = UVar4;
  pCVar7 = &this->super_ComputePipelineStateCreateInfo;
  (pCVar7->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType = SVar11;
  *(undefined3 *)&(pCVar7->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1 = uVar12;
  (pCVar7->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages = SVar13
  ;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
  super_DeviceObjectAttribs.Name = pCVar3;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.PipelineType =
       PVar14;
  *(undefined3 *)
   &(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.field_0x9 =
       uVar15;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
  SRBAllocationGranularity = UVar16;
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (&this->ResourceLayout,&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::vector(&this->Objects);
  std::
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ::vector(&this->Signatures);
  CopyPSOCreateInternalInfo
            ((Diligent *)&this->InternalData,(CI->super_PipelineStateCreateInfo).pInternalData);
  SetName(this,(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
               super_DeviceObjectAttribs.Name);
  for (local_20 = 0; local_20 < (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount;
      local_20 = local_20 + 1) {
    AddSignature(this,(CI->super_PipelineStateCreateInfo).ppResourceSignatures[local_20]);
  }
  if ((CI->super_PipelineStateCreateInfo).pPSOCache != (IPipelineStateCache *)0x0) {
    SetPipelineStateCache(this,(CI->super_PipelineStateCreateInfo).pPSOCache);
  }
  memcpy(&(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
          ResourceLayout,&this->ResourceLayout,0x28);
  puVar17 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      (&this->InternalData);
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData = puVar17
  ;
  return;
}

Assistant:

PipelineStateCreateInfoX(const CreateInfoType& CI) noexcept :
        CreateInfoType{CI},
        ResourceLayout{CI.PSODesc.ResourceLayout},
        InternalData{CopyPSOCreateInternalInfo(CI.pInternalData)}
    {
        SetName(this->PSODesc.Name);
        for (size_t i = 0; i < CI.ResourceSignaturesCount; ++i)
            AddSignature(CI.ppResourceSignatures[i]);
        if (CI.pPSOCache != nullptr)
            SetPipelineStateCache(CI.pPSOCache);
        this->PSODesc.ResourceLayout = ResourceLayout;
        this->pInternalData          = InternalData.get();
    }